

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Hash.cpp
# Opt level: O0

uint16_t axl::sl::checksum16(void *_p,size_t size)

{
  ushort_t *puVar1;
  long lVar2;
  uintptr_t sum;
  uchar_t *last;
  ushort_t *p;
  size_t size_local;
  void *_p_local;
  
  puVar1 = (ushort_t *)((long)_p + (size - 1));
  sum = 0;
  for (p = (ushort_t *)_p; p < puVar1; p = p + 1) {
    sum = *p + sum;
  }
  if ((size & 1) != 0) {
    sum = (byte)*puVar1 + sum;
  }
  lVar2 = (sum >> 0x10) + (sum & 0xffff);
  return (short)((ulong)lVar2 >> 0x10) + (short)lVar2 ^ 0xffff;
}

Assistant:

uint16_t
checksum16(
	const void* _p,
	size_t size
) {
	ushort_t* p = (ushort_t*)_p;
	uchar_t* last = (uchar_t*)_p + size - 1;

	uintptr_t sum = 0;

	for (; (uchar_t*)p < last; p++)
		sum += *p;

	if (size & 1)
		sum += *last;

	sum = (sum >> 16) + (sum & 0xffff);
	sum += (sum >> 16);

	return (ushort_t) ~sum;
}